

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_fun.c
# Opt level: O0

double ex_dofact(int i)

{
  undefined4 local_18;
  undefined4 local_14;
  float ret;
  int i_local;
  
  if (i < 1) {
    _ret = 1.0;
  }
  else {
    local_18 = 1.0;
    local_14 = i;
    do {
      local_18 = (float)local_14 * local_18;
      local_14 = local_14 + -1;
    } while (local_14 != 0);
    _ret = (double)local_18;
  }
  return _ret;
}

Assistant:

static double
ex_dofact(int i)
{
        float ret = 0;

        if (i > 0)
                ret = 1;
        else
                return (1);

        do {
                ret *= i;
        } while (--i);

        return(ret);
}